

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> * __thiscall
ary::BinaryPatternLocalizer::localize
          (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           *__return_storage_ptr__,BinaryPatternLocalizer *this,Mat *image)

{
  Mat *pMVar1;
  Mat *src;
  float fVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  reference pvVar8;
  reference pvVar9;
  PlanarLocalization *this_00;
  uint uVar10;
  int iVar11;
  size_type sVar12;
  ulong __n;
  BinaryPatternLocalizer *this_01;
  int in_R8D;
  int iVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  double dVar17;
  Point_<float> PVar18;
  _InputArray local_2c8;
  vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *local_2b0;
  value_type local_2a8;
  float fStack_2a0;
  float fStack_29c;
  int orientation;
  value_type local_288;
  undefined8 uStack_280;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> polycont;
  double confidence;
  Size2f local_250;
  element_type *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_240;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> refined;
  undefined1 local_1e8 [12];
  int iStack_1dc;
  size_t local_1d8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> rotated;
  uchar *local_1b8;
  uchar *local_1b0;
  MatAllocator *local_1a8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> roi;
  CameraPosition camera;
  Mat rectifiedPatch;
  _Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_a8;
  Mat contourMat;
  
  local_2b0 = (vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *)
              __return_storage_ptr__;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&roi,4,(allocator_type *)&rectifiedPatch);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&refined,4,(allocator_type *)&rectifiedPatch);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&rotated,4,(allocator_type *)&rectifiedPatch);
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((image->flags & 0xff8U) == 0x10) {
    rectifiedPatch.data = (uchar *)0x0;
    rectifiedPatch.flags = 0x1010000;
    contourMat.data = (uchar *)0x0;
    contourMat._8_8_ = &this->grayImage;
    contourMat.flags = 0x2010000;
    rectifiedPatch._8_8_ = image;
    cv::cvtColor((cv *)&rectifiedPatch,(_InputArray *)&contourMat,(_OutputArray *)0x6,0,in_R8D);
  }
  else {
    rectifiedPatch.data = (uchar *)0x0;
    rectifiedPatch._8_8_ = &this->grayImage;
    rectifiedPatch.flags = 0x2010000;
    cv::Mat::copyTo((_OutputArray *)image);
  }
  src = &this->grayImage;
  rectifiedPatch.data = (uchar *)0x0;
  rectifiedPatch.flags = 0x1010000;
  contourMat.data = (uchar *)0x0;
  pMVar1 = &this->binImage;
  contourMat.flags = 0x2010000;
  rectifiedPatch._8_8_ = src;
  contourMat._8_8_ = pMVar1;
  cv::adaptiveThreshold
            ((_InputArray *)&rectifiedPatch,(_OutputArray *)&contourMat,255.0,1,1,
             (int)this->block_size,(double)(int)this->threshold);
  camera.translation.val[1] = 0.0;
  camera.translation.val[2] = 0.0;
  local_2c8.sz.width = 0;
  local_2c8.sz.height = 0;
  camera.rotation.val[0] = 2.3693558e-38;
  local_2c8.flags = 0x2010000;
  local_2c8.obj = pMVar1;
  camera._8_8_ = pMVar1;
  cv::Mat::Mat(&rectifiedPatch);
  local_1d8 = 0;
  local_1e8._0_4_ = 0x1010000;
  local_1a8 = (MatAllocator *)0xffffffffffffffff;
  unique0x10000b0b = &rectifiedPatch;
  cv::Scalar_<double>::all((Scalar_<double> *)&contourMat,1.79769313486232e+308);
  cv::dilate(&camera,&local_2c8,local_1e8,&local_1a8,1,0,&contourMat);
  cv::Mat::~Mat(&rectifiedPatch);
  iVar13 = (this->binImage).cols + (this->binImage).rows;
  iVar3 = iVar13 / 2;
  rectifiedPatch.data = (uchar *)0x0;
  rectifiedPatch.flags = 0x1010000;
  contourMat.data = (uchar *)0x0;
  contourMat.flags = -0x7dfbfff4;
  contourMat._8_8_ = &contours;
  rectifiedPatch._8_8_ = pMVar1;
  cv::findContours(&rectifiedPatch,&contourMat,1);
  cv::Mat::Mat(&rectifiedPatch,100,100,0);
  *(pointer *)(local_2b0 + 0x10) = (pointer)0x0;
  *(undefined8 *)local_2b0 = 0;
  *(pointer *)(local_2b0 + 8) = (pointer)0x0;
  iVar6 = iVar3 * 4;
  uVar10 = 0;
  while( true ) {
    this_01 = (BinaryPatternLocalizer *)&camera;
    if ((ulong)(((long)contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)contours.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar10) break;
    cv::Mat::Mat<cv::Point_<int>>
              (&contourMat,
               contours.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10,false);
    camera.translation.val[1] = 0.0;
    camera.translation.val[2] = 0.0;
    camera.rotation.val[0] = 2.3693558e-38;
    camera._8_8_ = &contourMat;
    dVar17 = (double)cv::arcLength((_InputArray *)this_01,true);
    if (((double)(iVar13 / 0xc) < dVar17) && (dVar17 < (double)iVar6)) {
      if (polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
             .super__Vector_impl_data._M_start;
      }
      camera.translation.val[1] = 0.0;
      camera.translation.val[2] = 0.0;
      camera.rotation.val[0] = 2.3693558e-38;
      local_2c8.sz.width = 0;
      local_2c8.sz.height = 0;
      local_2c8.flags = 0x8203000c;
      local_2c8.obj = (BinaryPatternLocalizer *)&polycont;
      camera._8_8_ = &contourMat;
      cv::approxPolyDP((_InputArray *)this_01,(_OutputArray *)&local_2c8,dVar17 * 0.02,true);
      if ((long)polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x20) {
        cv::Mat::Mat<cv::Point_<int>>((Mat *)this_01,&polycont,false);
        local_2c8.sz.width = 0;
        local_2c8.sz.height = 0;
        local_2c8.flags = 0x1010000;
        local_2c8.obj = this_01;
        cVar5 = cv::isContourConvex(&local_2c8);
        cv::Mat::~Mat((Mat *)this_01);
        if (cVar5 != '\0') {
          pvVar8 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at(&polycont,0);
          local_2a8 = *pvVar8;
          fStack_2a0 = 0.0;
          fStack_29c = 0.0;
          uStack_280 = 0;
          local_288 = local_2a8;
          for (sVar12 = 1; sVar12 != 4; sVar12 = sVar12 + 1) {
            pvVar8 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                               (&polycont,sVar12);
            uVar7 = pvVar8->x;
            uVar4 = pvVar8->y;
            fStack_2a0 = (float)(~-(uint)((int)fStack_2a0 < 0) & (uint)fStack_2a0);
            fStack_29c = (float)(~-(uint)((int)fStack_29c < 0) & (uint)fStack_29c);
            local_2a8.y = ~-(uint)(local_2a8.y < (int)uVar4) & local_2a8.y |
                          uVar4 & -(uint)(local_2a8.y < (int)uVar4);
            local_2a8.x = ~-(uint)(local_2a8.x < (int)uVar7) & local_2a8.x |
                          uVar7 & -(uint)(local_2a8.x < (int)uVar7);
            local_288.y = ~-(uint)((int)uVar4 < local_288.y) & local_288.y |
                          uVar4 & -(uint)((int)uVar4 < local_288.y);
            local_288.x = ~-(uint)((int)uVar7 < local_288.x) & local_288.x |
                          uVar7 & -(uint)((int)uVar7 < local_288.x);
            uStack_280 = CONCAT44(~-(uint)(0 < (int)uStack_280._4_4_) & uStack_280._4_4_,
                                  ~-(uint)(0 < (int)(uint)uStack_280) & (uint)uStack_280);
          }
          local_1e8._0_4_ = local_288.x;
          local_1e8._4_4_ = local_288.y;
          stack0xfffffffffffffe20 =
               (Mat *)CONCAT44((local_2a8.y - local_288.y) + 1,(local_2a8.x - local_288.x) + 1);
          uVar14 = 0xffffffff;
          local_2a8 = (value_type)(double)(iVar6 * iVar3);
          for (__n = 0; __n != 4; __n = __n + 1) {
            pvVar8 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                               (&polycont,__n);
            dVar17 = SQRT((double)pvVar8->x * (double)pvVar8->x +
                          (double)pvVar8->y * (double)pvVar8->y);
            if (dVar17 < (double)local_2a8) {
              uVar14 = __n & 0xffffffff;
              local_2a8 = (value_type)dVar17;
            }
          }
          for (sVar12 = 0; sVar12 != 4; sVar12 = sVar12 + 1) {
            pvVar8 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                               (&polycont,sVar12);
            PVar18.x = (float)(*pvVar8).x;
            PVar18.y = (float)(*pvVar8).y;
            refined.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar12] = PVar18;
          }
          camera.translation.val[1] = 0.0;
          camera.translation.val[2] = 0.0;
          local_2c8.sz.width = 0;
          local_2c8.sz.height = 0;
          camera.rotation.val[0] = 2.3693558e-38;
          local_2c8.flags = 0x8303000d;
          local_2c8.obj = &refined;
          local_1b0 = (uchar *)0x300000003;
          local_1b8 = (uchar *)0xffffffffffffffff;
          camera._8_8_ = src;
          cv::cornerSubPix(0x3ff0000000000000,this_01,&local_2c8,&local_1b0,&local_1b8,0x300000001);
          iVar11 = (int)uVar14 + 4;
          local_2a8.y = (int)(float)local_288.y;
          local_2a8.x = (int)(float)local_288.x;
          _fStack_2a0 = CONCAT44((float)(int)uStack_280._4_4_,(float)(int)(uint)uStack_280);
          fVar16 = (float)local_288.y;
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
            this_01 = (BinaryPatternLocalizer *)&refined;
            pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                               ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                                this_01,(long)(iVar11 % 4));
            local_288.x = (int)pvVar9->x;
            pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                               ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                                this_01,(long)(iVar11 % 4));
            fVar2 = pvVar9->y;
            roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15].x = (float)local_288.x - (float)local_2a8.x;
            roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15].y = fVar2 - fVar16;
            iVar11 = iVar11 + -1;
          }
          rectifyPattern(this_01,src,&roi,(Rect *)local_1e8,&rectifiedPatch);
          confidence = 0.0;
          uVar7 = identifyPattern(this,&rectifiedPatch,&confidence,&orientation);
          if (-1 < (int)uVar7) {
            iVar11 = ((int)uVar14 - orientation) + 8;
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                                 (&refined,(long)(iVar11 % 4));
              rotated.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15] = *pvVar9;
              iVar11 = iVar11 + -1;
            }
            calculateExtrinsics(&camera,this,
                                (this->patterns).
                                super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7].size,&rotated);
            this_00 = (PlanarLocalization *)operator_new(0x48);
            local_250.width =
                 (this->patterns).
                 super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar7].size;
            local_250.height = local_250.width;
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                      ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&local_a8,
                       &rotated);
            PlanarLocalization::PlanarLocalization
                      (this_00,uVar7,&camera,&local_250,
                       (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&local_a8,
                       (float)confidence);
            std::__shared_ptr<ary::PlanarLocalization,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<ary::PlanarLocalization,void>
                      ((__shared_ptr<ary::PlanarLocalization,(__gnu_cxx::_Lock_policy)2> *)
                       &local_248,this_00);
            local_2c8._0_8_ = local_248;
            local_2c8.obj = _Stack_240._M_pi;
            local_248 = (element_type *)0x0;
            _Stack_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>>::
            emplace_back<cv::Ptr<ary::Localization>>(local_2b0,(Ptr<ary::Localization> *)&local_2c8)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8.obj);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_240);
            std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                      (&local_a8);
          }
        }
      }
    }
    cv::Mat::~Mat(&contourMat);
    uVar10 = uVar10 + 1;
  }
  cv::Mat::~Mat(&rectifiedPatch);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&rotated.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&refined.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  return (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *)
         local_2b0;
}

Assistant:

vector<SharedLocalization> BinaryPatternLocalizer::localize(const Mat& image) {

	vector<Point2f> roi(4);
	vector<Point2f> refined(4);
    vector<Point2f> rotated(4);

	vector<vector<Point> > contours;
	vector<Point> polycont;

    //binarize image
    if (image.channels() == 3) {
	    cvtColor(image, grayImage, COLOR_BGR2GRAY);
    }
    else {
	    image.copyTo(grayImage);
    }

    adaptiveThreshold(grayImage, binImage, 255, ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY_INV, block_size, (int) threshold);
    dilate(binImage, binImage, Mat());

	int avsize = (binImage.rows + binImage.cols) / 2;

	//find contours in binary image
	cv::findContours(binImage, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

	unsigned int i;
	Point p;
	int pMinX, pMinY, pMaxY, pMaxX;
    Mat rectifiedPatch(PATTERN_SIZE, PATTERN_SIZE, CV_8UC1);;

    vector<SharedLocalization> localizations;

	for (i = 0; i < contours.size(); i++) {
		Mat contourMat = Mat (contours[i]);
		const double per = arcLength( contourMat, true);
		//check the perimeter

		if (per > (avsize / 6) && per < (4 * avsize)) {

			polycont.clear();
			approxPolyDP( contourMat, polycont, per * 0.02, true);
			//check rectangularity and convexity
			if (polycont.size() == 4 && isContourConvex(Mat (polycont))) {

				//locate the 2D box of contour,
				p = polycont.at(0);
				pMinX = pMaxX = p.x;
				pMinY = pMaxY = p.y;
				int j;
				for (j = 1; j < 4; j++) {
					p = polycont.at(j);
					if (p.x < pMinX) {
						pMinX = p.x;
					}
					if (p.x > pMaxX) {
						pMaxX = p.x;
					}
					if (p.y < pMinY) {
						pMinY = p.y;
					}
					if (p.y > pMaxY) {
						pMaxY = p.y;
					}
				}
				Rect box(pMinX, pMinY, pMaxX - pMinX + 1, pMaxY - pMinY + 1);

				//find the upper left vertex
				double d;
				double dmin = (4 * avsize * avsize);
				int v1 = -1;
				for (j = 0; j < 4; j++) {
					d = norm(polycont.at(j));
					if (d < dmin) {
						dmin = d;
						v1 = j;
					}
				}

				//store vertices in refinedVertices and enable sub-pixel refinement if you want
				for (j = 0; j < 4; j++) {
					refined[j] = polycont.at(j);
				}

				//refine corners
				cornerSubPix(grayImage, refined, Size(3, 3), Size(-1, -1), TermCriteria(1, 3, 1));

				//rotate vertices based on upper left vertex; this gives you the most trivial homogrpahy
				for (j = 0; j < 4; j++) {
					roi[j] = Point2f(refined.at((4 + v1 - j) % 4).x - pMinX, refined.at((4 + v1 - j) % 4).y - pMinY);
				}

	            //rectify the candidate pattern (find homography and warp the ROI)
	            rectifyPattern(grayImage, roi, box, rectifiedPatch);

	            double confidence = 0;
	            int orientation;

	            int id = identifyPattern(rectifiedPatch, confidence, orientation);
	            //push-back pattern in the stack of foundPatterns and find its extrinsics

	            if (id >= 0) {

		            for (j = 0; j < 4; j++) {
			            rotated[j] = refined.at((8 - orientation + v1 - j) % 4);
		            }

		            //find the transformation (from camera CS to pattern CS)
		            CameraPosition camera = calculateExtrinsics(patterns[id].getSize(), rotated);
		            localizations.push_back(Ptr<PlanarLocalization>(new PlanarLocalization(id, camera, Size2f(patterns[id].getSize(), patterns[id].getSize()), rotated, (float) confidence)));

	            }


			}
		}
	}

    return localizations;
}